

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O1

string * __thiscall
AliHttpRequest::GetPath_abi_cxx11_
          (string *__return_storage_ptr__,AliHttpRequest *this,bool with_query)

{
  pointer pcVar1;
  long *plVar2;
  char *pcVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->path_)._M_string_length);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c75bd);
  }
  if ((this->is_tls == false) && ((this->proxy_host_)._M_string_length != 0)) {
    std::operator+(&local_70,"http://",&this->host_);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p)
    ;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_40 = *plVar4;
      lStack_38 = plVar2[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar4;
      local_50 = (long *)*plVar2;
    }
    local_48 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if (with_query) {
    if ((this->query_)._M_string_length != 0) {
      pcVar3 = (char *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append(pcVar3,(ulong)(this->query_)._M_dataplus._M_p);
    }
    if ((this->flagment_)._M_string_length != 0) {
      pcVar3 = (char *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append(pcVar3,(ulong)(this->flagment_)._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AliHttpRequest::GetPath(bool with_query) {
  std::string path = this->path_;

  if(path.empty()) {
    path = "/";
  }

  // support http proxy only
  if(!this->is_tls && !this->proxy_host_.empty()) {
    path = "http://" + this->host_ + path;
  }
  
  if(with_query) {
    if(!this->query_.empty()) {
      path.append("?").append(query_);
    }
    if(!this->flagment_.empty()) {
      path.append("#").append(flagment_);
    }
  }

  return path;
}